

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

string * __thiscall
libcellml::Component::math_abi_cxx11_(string *__return_storage_ptr__,Component *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl[4].mId.field_2._M_local_buf);
  return __return_storage_ptr__;
}

Assistant:

std::string Component::math() const
{
    return pFunc()->mMath;
}